

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_dform3D(DisasContext_conflict10 *ctx)

{
  _Bool _Var1;
  TCGContext_conflict10 *pTVar2;
  TCGv_ptr pTVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  uintptr_t o_1;
  TCGv_i64 pTVar7;
  uintptr_t o_4;
  TCGv_i64 pTVar8;
  uint32_t excp;
  TCGOpcode opc;
  TCGContext_conflict10 *s;
  MemOp_conflict memop;
  uintptr_t o_5;
  TCGv_i64 pTVar9;
  TCGContext_conflict10 *tcg_ctx;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uintptr_t o;
  TCGv_i64 pTVar13;
  
  uVar12 = ctx->opcode;
  switch(uVar12 & 3) {
  case 0:
    if ((ctx->insns_flags2 & 0x20) == 0) {
LAB_00b82928:
      gen_exception_err(ctx,0x60,0x21);
      return;
    }
    if (ctx->fpu_enabled == false) {
      excp = 7;
      goto LAB_00b82e06;
    }
    s = ctx->uc->tcg_ctx;
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
      tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)s),0x30);
      ctx->access_type = 0x30;
    }
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar9 = (TCGv_i64)((long)pTVar4 - (long)s);
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar13 = (TCGv_i64)((long)pTVar4 - (long)s);
    pTVar2 = ctx->uc->tcg_ctx;
    uVar12 = ctx->opcode;
    pTVar8 = (TCGv_i64)(long)(short)uVar12;
    uVar10 = uVar12 >> 0x10 & 0x1f;
    if (uVar10 == 0) {
      pTVar7 = (TCGv_i64)((ulong)pTVar8 & 0xffffffff);
      if (ctx->sf_mode != false) {
        pTVar7 = pTVar8;
      }
      opc = INDEX_op_movi_i64;
LAB_00b82961:
      tcg_gen_op2_ppc64(pTVar2,opc,(TCGArg)(pTVar9 + (long)pTVar2),(TCGArg)pTVar7);
    }
    else if ((uVar12 & 0xffff) == 0) {
      pTVar7 = cpu_gpr[uVar10];
      if (ctx->sf_mode == false) goto LAB_00b826ff;
      if (pTVar7 != pTVar9) {
        pTVar7 = pTVar7 + (long)pTVar2;
        opc = INDEX_op_mov_i64;
        goto LAB_00b82961;
      }
    }
    else {
      tcg_gen_addi_i64_ppc64(pTVar2,pTVar9,cpu_gpr[uVar10],(int64_t)pTVar8);
      pTVar7 = pTVar9;
      if (ctx->sf_mode == false) {
LAB_00b826ff:
        tcg_gen_ext32u_i64_ppc64(pTVar2,pTVar9,pTVar7);
      }
    }
    _Var1 = ctx->le_mode;
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((uint)_Var1 * 0x10 + 0x12b28 + (ctx->opcode >> 0x11 & 0x1f0)));
    tcg_gen_qemu_st_i64_ppc64
              (ctx->uc->tcg_ctx,pTVar13,pTVar9,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
    tcg_gen_addi_i64_ppc64(s,pTVar9,pTVar9,8);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)((ctx->opcode >> 0x11 & 0x1f0) + 0x12b28 + (uint)(_Var1 ^ 1) * 0x10));
    tcg_gen_qemu_st_i64_ppc64
              (ctx->uc->tcg_ctx,pTVar13,pTVar9,(long)ctx->mem_idx,
               ctx->default_tcg_memop_mask | MO_64);
LAB_00b82dca:
    pTVar4 = (TCGTemp *)(pTVar9 + (long)s);
    break;
  case 1:
    if ((uVar12 & 5) == 5) {
      if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00b82928;
      s = ctx->uc->tcg_ctx;
      uVar10 = uVar12 * 4 & 0x20;
      if (uVar10 == 0) {
        if (ctx->vsx_enabled == false) goto LAB_00b82a63;
      }
      else if (ctx->altivec_enabled == false) goto LAB_00b82df4;
      pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      iVar11 = (uVar10 | uVar12 >> 0x15 & 0x1f) * 0x10;
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(iVar11 + 0x12b28));
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(iVar11 + 0x12b20));
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar2 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar2),0x20);
        ctx->access_type = 0x20;
      }
      pTVar9 = (TCGv_i64)((long)pTVar4 - (long)s);
      pTVar13 = (TCGv_i64)((long)pTVar5 - (long)s);
      pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar8 = (TCGv_i64)((long)pTVar4 - (long)s);
      gen_addr_imm_index(ctx,pTVar8,0xf);
      if (ctx->le_mode == true) {
        tcg_gen_qemu_st_i64_ppc64(s,pTVar13,pTVar8,(long)ctx->mem_idx,MO_64);
        tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
        iVar11 = ctx->mem_idx;
        memop = MO_64;
        pTVar7 = pTVar9;
      }
      else {
        tcg_gen_qemu_st_i64_ppc64(s,pTVar9,pTVar8,(long)ctx->mem_idx,MO_BEQ);
        tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
        iVar11 = ctx->mem_idx;
        memop = MO_BEQ;
        pTVar7 = pTVar13;
      }
      tcg_gen_qemu_st_i64_ppc64(s,pTVar7,pTVar8,(long)iVar11,memop);
      tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar8 + (long)s));
      goto LAB_00b82dca;
    }
    if (((uVar12 & 5) != 1) || ((ctx->insns_flags2 & 0x80000) == 0)) goto LAB_00b82928;
    s = ctx->uc->tcg_ctx;
    uVar10 = uVar12 * 4 & 0x20;
    if (uVar10 == 0) {
      if (ctx->vsx_enabled == false) {
LAB_00b82a63:
        excp = 0x5e;
        goto LAB_00b82e06;
      }
    }
    else if (ctx->altivec_enabled == false) goto LAB_00b82df4;
    pTVar5 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar2),0x20);
      ctx->access_type = 0x20;
    }
    pTVar9 = (TCGv_i64)((long)pTVar5 - (long)s);
    pTVar13 = (TCGv_i64)((long)pTVar4 - (long)s);
    pTVar6 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    pTVar8 = (TCGv_i64)((long)pTVar6 - (long)s);
    gen_addr_imm_index(ctx,pTVar8,0xf);
    iVar11 = (uVar10 | uVar12 >> 0x15 & 0x1f) * 0x10;
    if (ctx->le_mode == true) {
      tcg_gen_qemu_ld_i64_ppc64(s,pTVar13,pTVar8,(long)ctx->mem_idx,MO_64);
      tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(iVar11 + 0x12b20));
      tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
      tcg_gen_qemu_ld_i64_ppc64(s,pTVar9,pTVar8,(long)ctx->mem_idx,MO_64);
      uVar12 = iVar11 + 0x12b28;
      pTVar3 = s->cpu_env;
      pTVar4 = pTVar5;
    }
    else {
      tcg_gen_qemu_ld_i64_ppc64(s,pTVar9,pTVar8,(long)ctx->mem_idx,MO_BEQ);
      tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar5,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(iVar11 + 0x12b28));
      tcg_gen_addi_i64_ppc64(s,pTVar8,pTVar8,8);
      tcg_gen_qemu_ld_i64_ppc64(s,pTVar13,pTVar8,(long)ctx->mem_idx,MO_BEQ);
      uVar12 = iVar11 + 0x12b20;
      pTVar3 = s->cpu_env;
    }
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)pTVar4,(TCGArg)(pTVar3 + (long)s),(ulong)uVar12);
    tcg_temp_free_internal_ppc64(s,(TCGTemp *)(pTVar8 + (long)s));
    pTVar4 = (TCGTemp *)(pTVar9 + (long)s);
    break;
  case 2:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00b82928;
    if (ctx->altivec_enabled != false) {
      s = ctx->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar13 = (TCGv_i64)((long)pTVar4 - (long)s);
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar2 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar2),0x20);
        ctx->access_type = 0x20;
      }
      pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      gen_addr_imm_index(ctx,(TCGv_i64)((long)pTVar4 - (long)s),3);
      tcg_gen_qemu_st_i64_ppc64
                (ctx->uc->tcg_ctx,pTVar13,(TCGv_i64)((long)pTVar4 - (long)s),(long)ctx->mem_idx,
                 ctx->default_tcg_memop_mask | MO_64);
LAB_00b828c4:
      tcg_temp_free_internal_ppc64(s,pTVar4);
      pTVar4 = (TCGTemp *)(pTVar13 + (long)s);
      goto LAB_00b82de1;
    }
    goto LAB_00b82df4;
  case 3:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_00b82928;
    if (ctx->altivec_enabled != false) {
      s = ctx->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      pTVar13 = (TCGv_i64)((long)pTVar4 - (long)s);
      tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)pTVar4,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12d28);
      if ((ctx->need_access_type == true) && (ctx->access_type != 0x20)) {
        pTVar2 = ctx->uc->tcg_ctx;
        tcg_gen_op2_ppc64(pTVar2,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)pTVar2),0x20);
        ctx->access_type = 0x20;
      }
      pTVar4 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      gen_addr_imm_index(ctx,(TCGv_i64)((long)pTVar4 - (long)s),3);
      gen_qemu_st32fs(ctx,pTVar13,(TCGv_i64)((long)pTVar4 - (long)s));
      goto LAB_00b828c4;
    }
LAB_00b82df4:
    excp = 0x49;
LAB_00b82e06:
    gen_exception(ctx,excp);
    return;
  }
  tcg_temp_free_internal_ppc64(s,pTVar4);
  pTVar4 = (TCGTemp *)(pTVar13 + (long)s);
LAB_00b82de1:
  tcg_temp_free_internal_ppc64(s,pTVar4);
  return;
}

Assistant:

static void gen_dform3D(DisasContext *ctx)
{
    if ((ctx->opcode & 3) == 1) { /* DQ-FORM */
        switch (ctx->opcode & 0x7) {
        case 1: /* lxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_lxv(ctx);
            }
            break;
        case 5: /* stxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxv(ctx);
            }
            break;
        }
    } else { /* DS-FORM */
        switch (ctx->opcode & 0x3) {
        case 0: /* stfdp */
            if (ctx->insns_flags2 & PPC2_ISA205) {
                return gen_stfdp(ctx);
            }
            break;
        case 2: /* stxsd */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxsd(ctx);
            }
            break;
        case 3: /* stxssp */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxssp(ctx);
            }
            break;
        }
    }
    return gen_invalid(ctx);
}